

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::ForStmt> __thiscall
mocker::Parser::forStmt(Parser *this,TokIter *iter,TokIter end)

{
  Token *pTVar1;
  Position end_00;
  Position end_01;
  Position end_02;
  Position end_03;
  Position end_04;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> pVar2;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> pVar3;
  size_t sVar4;
  TokenID TVar5;
  mapped_type *pmVar6;
  CompileError *pCVar7;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  shared_ptr<mocker::ast::ForStmt> sVar9;
  Position beg;
  Position beg_00;
  Position beg_01;
  Position beg_02;
  Position beg_03;
  Position beg_04;
  Position end_05;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> local_98;
  size_t local_90;
  TokIter *local_88;
  size_t local_80;
  size_t local_78;
  shared_ptr<mocker::ast::Statement> stmt;
  shared_ptr<mocker::ast::Expression> condition;
  shared_ptr<mocker::ast::Expression> update;
  shared_ptr<mocker::ast::Expression> init;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  
  Token::position(*end._M_current);
  sVar4 = local_90;
  pVar2 = local_98;
  _Var8._M_pi = extraout_RDX;
  if (*end._M_current != in_RCX) {
    TVar5 = Token::tokenID(*end._M_current);
    _Var8._M_pi = extraout_RDX_00;
    if (TVar5 == For) {
      pTVar1 = (Token *)(*(long *)end._M_current + 0x38);
      *(long *)end._M_current = *(long *)end._M_current + 0x70;
      if (pTVar1 == in_RCX) {
LAB_0017eafc:
        pCVar7 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        end_00.col = local_80;
        end_00.line = (size_t)local_88;
        beg_00.col = local_90;
        beg_00.line._0_4_ = local_98.first;
        beg_00.line._4_4_ = local_98.second;
        CompileError::CompileError(pCVar7,beg_00,end_00);
        *(undefined ***)pCVar7 = &PTR__CompileError_001eba98;
        __cxa_throw(pCVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      TVar5 = Token::tokenID(pTVar1);
      if (TVar5 != LeftParen) goto LAB_0017eafc;
      local_98 = (pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>)logicalOrExpr;
      local_90 = 0;
      condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x2f;
      local_88 = iter;
      auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
                ((Parser *)&init,iter,end,
                 (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
                  *)in_RCX,&local_98);
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      if (pTVar1 == in_RCX) {
LAB_0017eb54:
        pCVar7 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        pVar3 = local_98;
        end_01.col = local_80;
        end_01.line = (size_t)local_88;
        beg_01.col = sVar4;
        local_98.first = pVar2.first;
        local_98.second = pVar2.second;
        beg_01.line._0_4_ = local_98.first;
        beg_01.line._4_4_ = local_98.second;
        local_98 = pVar3;
        CompileError::CompileError(pCVar7,beg_01,end_01);
        *(undefined ***)pCVar7 = &PTR__CompileError_001eba98;
        __cxa_throw(pCVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      TVar5 = Token::tokenID(pTVar1);
      if (TVar5 != Semicolon) goto LAB_0017eb54;
      local_98 = (pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>)logicalOrExpr;
      local_90 = 0;
      update.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x2f;
      local_88 = iter;
      auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
                ((Parser *)&condition,iter,end,
                 (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
                  *)in_RCX,&local_98);
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      if (pTVar1 == in_RCX) {
LAB_0017ebac:
        pCVar7 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        pVar3 = local_98;
        end_02.col = local_80;
        end_02.line = (size_t)local_88;
        beg_02.col = sVar4;
        local_98.first = pVar2.first;
        local_98.second = pVar2.second;
        beg_02.line._0_4_ = local_98.first;
        beg_02.line._4_4_ = local_98.second;
        local_98 = pVar3;
        CompileError::CompileError(pCVar7,beg_02,end_02);
        *(undefined ***)pCVar7 = &PTR__CompileError_001eba98;
        __cxa_throw(pCVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      TVar5 = Token::tokenID(pTVar1);
      if (TVar5 != Semicolon) goto LAB_0017ebac;
      local_78 = sVar4;
      local_98 = (pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>)logicalOrExpr;
      local_90 = 0;
      stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x2f;
      local_88 = iter;
      auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
                ((Parser *)&update,iter,end,
                 (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
                  *)in_RCX,&local_98);
      pTVar1 = *end._M_current;
      *(Token **)end._M_current = pTVar1 + 1;
      if (pTVar1 == in_RCX) {
LAB_0017ec04:
        pCVar7 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        pVar3 = local_98;
        end_03.col = local_80;
        end_03.line = (size_t)local_88;
        beg_03.col = local_78;
        local_98.first = pVar2.first;
        local_98.second = pVar2.second;
        beg_03.line._0_4_ = local_98.first;
        beg_03.line._4_4_ = local_98.second;
        local_98 = pVar3;
        CompileError::CompileError(pCVar7,beg_03,end_03);
        *(undefined ***)pCVar7 = &PTR__CompileError_001eba98;
        __cxa_throw(pCVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      TVar5 = Token::tokenID(pTVar1);
      if (TVar5 != RightParen) goto LAB_0017ec04;
      statement((Parser *)&stmt,iter,end);
      if (stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pCVar7 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        pVar3 = local_98;
        end_04.col = local_80;
        end_04.line = (size_t)local_88;
        beg_04.col = local_78;
        local_98.first = pVar2.first;
        local_98.second = pVar2.second;
        beg_04.line._0_4_ = local_98.first;
        beg_04.line._4_4_ = local_98.second;
        local_98 = pVar3;
        CompileError::CompileError(pCVar7,beg_04,end_04);
        *(undefined ***)pCVar7 = &PTR__CompileError_001eba98;
        __cxa_throw(pCVar7,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      local_98 = (pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>)
                 stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pmVar6 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)iter[2]._M_current,(key_type *)&local_98);
      pVar3 = local_98;
      local_98.first = pVar2.first;
      local_98.second = pVar2.second;
      beg.col._0_4_ = local_98.first;
      beg.col._4_4_ = local_98.second;
      beg.line = (size_t)iter;
      end_05.col = (pmVar6->second).line;
      end_05.line = local_78;
      local_98 = pVar3;
      sVar9 = makeNode<mocker::ast::ForStmt,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Expression>&,std::shared_ptr<mocker::ast::Statement>&>
                        (this,beg,end_05,(shared_ptr<mocker::ast::Expression> *)(pmVar6->second).col
                         ,&init,&condition,(shared_ptr<mocker::ast::Statement> *)&update);
      _Var8 = sVar9.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var8._M_pi = extraout_RDX_01;
      }
      if (update.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (update.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var8._M_pi = extraout_RDX_02;
      }
      if (condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (condition.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var8._M_pi = extraout_RDX_03;
      }
      if (init.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (init.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var8._M_pi = extraout_RDX_04;
      }
      goto LAB_0017eaea;
    }
  }
  (this->tokBeg)._M_current = (Token *)0x0;
  (this->tokEnd)._M_current = (Token *)0x0;
LAB_0017eaea:
  sVar9.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar9.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::ForStmt>)
         sVar9.super___shared_ptr<mocker::ast::ForStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::ForStmt> Parser::forStmt(TokIter &iter, TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  if (id(iter) != TokenID::For)
    return nullptr;
  ++iter;
  if (id(iter++) != TokenID::LeftParen)
    throwError();
  auto init = expression(iter, end);
  if (id(iter++) != TokenID::Semicolon)
    throwError();
  auto condition = expression(iter, end);
  if (id(iter++) != TokenID::Semicolon)
    throwError();
  auto update = expression(iter, end);
  if (id(iter++) != TokenID::RightParen)
    throwError();
  auto stmt = statement(iter, end);
  if (!stmt)
    throwError();
  return makeNode<ast::ForStmt>(begPos, pos[stmt->getID()].second, init,
                                condition, update, stmt);
}